

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fps_compression.cpp
# Opt level: O2

void compress_vertices(char *filename)

{
  uint32_t nr_of_vertices_00;
  int val;
  ostream *poVar1;
  size_t __size;
  uint32_t i;
  ulong uVar2;
  uint32_t nr_of_vertices;
  uint32_t nr_of_floats;
  uint32_t nr_of_compressed_z_bytes;
  uint32_t nr_of_compressed_y_bytes;
  uint32_t nr_of_compressed_x_bytes;
  float *z;
  float *y;
  float *decompressed_z;
  float *decompressed_y;
  float *decompressed_x;
  float *x;
  float *vertices;
  uint8_t *compressed_z;
  uint8_t *compressed_y;
  uint8_t *compressed_x;
  uint32_t *triangles;
  uint32_t nr_of_triangles;
  
  val = trico_read_stl(&nr_of_vertices,&vertices,&nr_of_triangles,&triangles,filename);
  TestEq<int,int>(1,val,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                  ,0xac,"void compress_vertices(const char *)");
  nr_of_vertices_00 = nr_of_vertices;
  __size = (ulong)nr_of_vertices << 2;
  x = (float *)malloc(__size);
  y = (float *)malloc(__size);
  z = (float *)malloc(__size);
  trico_transpose_xyz_aos_to_soa(&x,&y,&z,vertices,nr_of_vertices_00);
  trico_compress(&nr_of_compressed_x_bytes,&compressed_x,x,nr_of_vertices,4,10);
  trico_decompress(&nr_of_floats,&decompressed_x,compressed_x);
  TestEq<unsigned_int,unsigned_int>
            (nr_of_vertices,nr_of_floats,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,0xbc,"void compress_vertices(const char *)");
  for (uVar2 = 0; uVar2 < nr_of_floats; uVar2 = uVar2 + 1) {
    TestEq<float,float>(x[uVar2],decompressed_x[uVar2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0xbf,"void compress_vertices(const char *)");
  }
  trico_compress(&nr_of_compressed_y_bytes,&compressed_y,y,nr_of_vertices,4,10);
  trico_decompress(&nr_of_floats,&decompressed_y,compressed_y);
  TestEq<unsigned_int,unsigned_int>
            (nr_of_vertices,nr_of_floats,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,200,"void compress_vertices(const char *)");
  for (uVar2 = 0; uVar2 < nr_of_floats; uVar2 = uVar2 + 1) {
    TestEq<float,float>(y[uVar2],decompressed_y[uVar2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0xcb,"void compress_vertices(const char *)");
  }
  trico_compress(&nr_of_compressed_z_bytes,&compressed_z,z,nr_of_vertices,4,10);
  trico_decompress(&nr_of_floats,&decompressed_z,compressed_z);
  TestEq<unsigned_int,unsigned_int>
            (nr_of_vertices,nr_of_floats,
             "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
             ,0xd4,"void compress_vertices(const char *)");
  for (uVar2 = 0; uVar2 < nr_of_floats; uVar2 = uVar2 + 1) {
    TestEq<float,float>(z[uVar2],decompressed_z[uVar2],
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico.tests/fps_compression.cpp"
                        ,0xd7,"void compress_vertices(const char *)");
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio for x: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)nr_of_vertices * 4.0) / (float)nr_of_compressed_x_bytes);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio for y: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)nr_of_vertices * 4.0) / (float)nr_of_compressed_y_bytes);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Compression ratio for z: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)nr_of_vertices * 4.0) / (float)nr_of_compressed_z_bytes);
  std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Total compression ratio: ");
  poVar1 = (ostream *)
           std::ostream::operator<<
                     (poVar1,((float)nr_of_vertices * 12.0) /
                             (float)(nr_of_compressed_y_bytes + nr_of_compressed_x_bytes +
                                    nr_of_compressed_z_bytes));
  std::operator<<(poVar1,"\n");
  free(decompressed_x);
  free(compressed_x);
  free(decompressed_y);
  free(compressed_y);
  free(decompressed_z);
  free(compressed_z);
  free(x);
  free(y);
  free(z);
  free(vertices);
  free(triangles);
  return;
}

Assistant:

void compress_vertices(const char* filename)
  {

  uint32_t nr_of_vertices;
  float* vertices;
  uint32_t nr_of_triangles;
  uint32_t* triangles;

  TEST_EQ(1, trico_read_stl(&nr_of_vertices, &vertices, &nr_of_triangles, &triangles, filename));

  float* x = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* y = (float*)trico_malloc(sizeof(float)*nr_of_vertices);
  float* z = (float*)trico_malloc(sizeof(float)*nr_of_vertices);

  trico_transpose_xyz_aos_to_soa(&x, &y, &z, vertices, nr_of_vertices);

  uint32_t nr_of_compressed_x_bytes;
  uint8_t* compressed_x;
  trico_compress(&nr_of_compressed_x_bytes, &compressed_x, x, nr_of_vertices, 4, 10);

  uint32_t nr_of_floats;
  float* decompressed_x;
  trico_decompress(&nr_of_floats, &decompressed_x, compressed_x);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(x[i], decompressed_x[i]);

  uint32_t nr_of_compressed_y_bytes;
  uint8_t* compressed_y;
  trico_compress(&nr_of_compressed_y_bytes, &compressed_y, y, nr_of_vertices, 4, 10);

  float* decompressed_y;
  trico_decompress(&nr_of_floats, &decompressed_y, compressed_y);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(y[i], decompressed_y[i]);

  uint32_t nr_of_compressed_z_bytes;
  uint8_t* compressed_z;
  trico_compress(&nr_of_compressed_z_bytes, &compressed_z, z, nr_of_vertices, 4, 10);

  float* decompressed_z;
  trico_decompress(&nr_of_floats, &decompressed_z, compressed_z);

  TEST_EQ(nr_of_vertices, nr_of_floats);

  for (uint32_t i = 0; i < nr_of_floats; ++i)
    TEST_EQ(z[i], decompressed_z[i]);


  std::cout << "Compression ratio for x: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_x_bytes << "\n";
  std::cout << "Compression ratio for y: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_y_bytes << "\n";
  std::cout << "Compression ratio for z: " << ((float)nr_of_vertices*4.f) / (float)nr_of_compressed_z_bytes << "\n";
  std::cout << "Total compression ratio: " << ((float)nr_of_vertices*12.f) / (float)(nr_of_compressed_x_bytes + nr_of_compressed_y_bytes + nr_of_compressed_z_bytes) << "\n";

  trico_free(decompressed_x);
  trico_free(compressed_x);
  trico_free(decompressed_y);
  trico_free(compressed_y);
  trico_free(decompressed_z);
  trico_free(compressed_z);
  trico_free(x);
  trico_free(y);
  trico_free(z);
  trico_free(vertices);
  trico_free(triangles);
  }